

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_range.c
# Opt level: O2

char * utf8_range_SkipAscii(char *data,char *end)

{
  long lVar1;
  
  lVar1 = (long)end - (long)data;
  for (; (7 < lVar1 && ((*(ulong *)data & 0x8080808080808080) == 0));
      data = (char *)((long)data + 8)) {
    lVar1 = lVar1 + -8;
  }
  for (; (data < end && (-1 < (char)*(ulong *)data)); data = (char *)((long)data + 1)) {
  }
  return data;
}

Assistant:

static inline const char* utf8_range_SkipAscii(const char* data,
                                               const char* end) {
  while (8 <= end - data &&
         (utf8_range_UnalignedLoad64(data) & 0x8080808080808080) == 0) {
    data += 8;
  }
  while (data < end && utf8_range_AsciiIsAscii(*data)) {
    ++data;
  }
  return data;
}